

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salsa20.cpp
# Opt level: O2

void __thiscall salsa20::print_key_array(salsa20 *this)

{
  ostream *poVar1;
  array<unsigned_int,_16UL> *__range1;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 4) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar1," ");
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void salsa20::print_key_array() const
{
    for (const auto &v : m_array)
        std::cout << v << " ";
    std::cout << std::endl;
}